

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cpp
# Opt level: O0

void __thiscall field3d<cellbe>::field3d(field3d<cellbe> *this,int nx0,int ny0,int nz0)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  void *pvVar5;
  type ppcVar6;
  type pppcVar7;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  int *in_RDI;
  int j;
  int i_1;
  int i;
  cellbe *in_stack_ffffffffffffff38;
  type in_stack_ffffffffffffff40;
  int local_50;
  int local_4c;
  int local_3c;
  
  *in_RDI = in_ESI;
  in_RDI[1] = in_EDX;
  in_RDI[2] = in_ECX;
  std::unique_ptr<cellbe**[],std::default_delete<cellbe**[]>>::
  unique_ptr<std::default_delete<cellbe**[]>,void>
            ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)in_stack_ffffffffffffff40
            );
  std::unique_ptr<cellbe*[],std::default_delete<cellbe*[]>>::
  unique_ptr<std::default_delete<cellbe*[]>,void>
            ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)in_stack_ffffffffffffff40);
  std::unique_ptr<cellbe[],std::default_delete<cellbe[]>>::
  unique_ptr<std::default_delete<cellbe[]>,void>
            ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)in_stack_ffffffffffffff40);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)*in_RDI;
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  memset(pvVar5,0,uVar4);
  std::unique_ptr<cellbe**[],std::default_delete<cellbe**[]>>::
  unique_ptr<cellbe***,std::default_delete<cellbe**[]>,void,bool>
            ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)in_stack_ffffffffffffff40
             ,(cellbe ***)in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_>::operator=
            ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)in_stack_ffffffffffffff40
             ,(unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)
              in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_>::~unique_ptr
            ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)in_stack_ffffffffffffff40
            );
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(*in_RDI * in_RDI[1]);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  memset(pvVar5,0,uVar4);
  std::unique_ptr<cellbe*[],std::default_delete<cellbe*[]>>::
  unique_ptr<cellbe**,std::default_delete<cellbe*[]>,void,bool>
            ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)in_stack_ffffffffffffff40,
             (cellbe **)in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_>::operator=
            ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)in_stack_ffffffffffffff40,
             (unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_>::~unique_ptr
            ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)in_stack_ffffffffffffff40);
  for (local_3c = 0; local_3c < *in_RDI; local_3c = local_3c + 1) {
    ppcVar6 = std::unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_>::operator[]
                        ((unique_ptr<cellbe_*[],_std::default_delete<cellbe_*[]>_> *)
                         in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    pppcVar7 = std::unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_>::operator[]
                         ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)
                          in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
    *pppcVar7 = ppcVar6;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(*in_RDI * in_RDI[1] * in_RDI[2]);
  uVar4 = SUB168(auVar3 * ZEXT816(0x18),0);
  if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar4);
  memset(pvVar5,0,uVar4);
  std::unique_ptr<cellbe[],std::default_delete<cellbe[]>>::
  unique_ptr<cellbe*,std::default_delete<cellbe[]>,void,bool>
            ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe[],_std::default_delete<cellbe[]>_>::operator=
            ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)in_stack_ffffffffffffff40,
             (unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)in_stack_ffffffffffffff38);
  std::unique_ptr<cellbe[],_std::default_delete<cellbe[]>_>::~unique_ptr
            ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)in_stack_ffffffffffffff40);
  for (local_4c = 0; local_4c < *in_RDI; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < in_RDI[1]; local_50 = local_50 + 1) {
      in_stack_ffffffffffffff40 =
           std::unique_ptr<cellbe[],_std::default_delete<cellbe[]>_>::operator[]
                     ((unique_ptr<cellbe[],_std::default_delete<cellbe[]>_> *)
                      in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      in_stack_ffffffffffffff38 =
           (cellbe *)
           std::unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_>::operator[]
                     ((unique_ptr<cellbe_**[],_std::default_delete<cellbe_**[]>_> *)
                      in_stack_ffffffffffffff40,(size_t)in_stack_ffffffffffffff38);
      ((cellbe **)in_stack_ffffffffffffff38->bex)[local_50] = in_stack_ffffffffffffff40;
    }
  }
  return;
}

Assistant:

field3d<T>::field3d(int nx0, int ny0, int nz0) : nx(nx0), ny(ny0), nz(nz0) {

    p = std::unique_ptr<T**[]>(new T**[nx]());

    p2 = std::unique_ptr<T*[]>(new T*[nx * ny]());
    for(int i=0; i<nx; i++)
    {
        p[i] = &(p2[ny*i]);
    }

    p3 = std::unique_ptr<T[]>(new T[nx * ny * nz]());
    for(int i=0; i<nx; i++)
    {
        for(int j=0; j<ny; j++)
        {
            p[i][j] = &(p3[nz*ny*i + nz*j]);
        }
    }
}